

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

int __thiscall ON_Xform::Compare(ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  double y;
  double x;
  double *a16;
  double *b;
  double *a;
  ON_Xform *rhs_local;
  ON_Xform *this_local;
  
  a16 = (double *)rhs;
  b = (double *)this;
  do {
    do {
      if (this + 1 <= b) {
        return 0;
      }
      pdVar3 = b + 1;
      dVar1 = *b;
      pdVar4 = a16 + 1;
      dVar2 = *a16;
      if (dVar1 < dVar2) {
        return -1;
      }
      if (dVar2 < dVar1) {
        return 1;
      }
      a16 = pdVar4;
      b = pdVar3;
    } while ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2)));
    if (!NAN(dVar1)) {
      return -1;
    }
  } while (NAN(dVar2));
  return 1;
}

Assistant:

int ON_Xform::Compare( const ON_Xform& rhs ) const
{
  const double* a = &m_xform[0][0];
  const double* b = &rhs.m_xform[0][0];
  const double* a16 = a + 16;
  while ( a < a16 )
  {
    const double x = *a++;
    const double y = *b++;
    if ( x < y )
      return -1;
    if ( x > y )
      return 1;
    if (x == y)
      continue;

    if (!(x == x))
    {
      // x is a nan
      if (!(y == y))
        continue; // x and y are nans
      return 1; // x is a nan and y is not.
    }

    // y is a nan and x is not a nan.
    return -1;
  }
  return 0;
}